

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderInterp *this,Index segment_index,Index func_index)

{
  Index index;
  bool bVar1;
  value_type local_c0;
  reference local_b8;
  ElemDesc *elem;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index func_index_local;
  Index segment_index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = func_index;
  local_1c = segment_index;
  _func_index_local = this;
  GetLocation(&local_48,this);
  index = local_20;
  GetLocation((Location *)&elem,this);
  Var::Var(&local_90,index,(Location *)&elem);
  local_24 = (Enum)SharedValidator::OnElemSegmentElemExpr_RefFunc
                             (&this->validator_,&local_48,&local_90);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_90);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_b8 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::back
                         (&this->module_->elems);
    local_c0.kind = RefFunc;
    local_c0.index = local_20;
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::push_back
              (&local_b8->elements,&local_c0);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                         Index func_index) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefFunc(
      GetLocation(), Var(func_index, GetLocation())));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefFunc, func_index});
  return Result::Ok;
}